

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Tensor::InternalSwap(Tensor *this,Tensor *other)

{
  Tensor *other_local;
  Tensor *this_local;
  
  google::protobuf::RepeatedField<long>::InternalSwap(&this->dimvalue_,&other->dimvalue_);
  std::swap<unsigned_int>(&this->rank_,&other->rank_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void Tensor::InternalSwap(Tensor* other) {
  dimvalue_.InternalSwap(&other->dimvalue_);
  std::swap(rank_, other->rank_);
  std::swap(_cached_size_, other->_cached_size_);
}